

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32_tests.cpp
# Opt level: O2

TestVector * __thiscall
anon_unknown.dwarf_290a69::TestVector::operator()
          (TestVector *this,string *pub,string *prv,uint nChild)

{
  long lVar1;
  pointer __first;
  ulong uVar2;
  pointer __result;
  undefined8 *puVar3;
  pointer pTVar4;
  pointer pTVar5;
  ulong uVar6;
  _Tp_alloc_type *__alloc;
  _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
  *this_00;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar5 = (this->vDerive).
           super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar5 == (this->vDerive).
                super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->vDerive).
              super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)pTVar5 - (long)__first;
    if (lVar7 == 0x7ffffffffffffff8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      goto LAB_0025caa4;
    }
    uVar2 = lVar7 / 0x48;
    uVar6 = 1;
    if (pTVar5 != __first) {
      uVar6 = uVar2;
    }
    this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
               *)(uVar6 + uVar2);
    if ((_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
         *)0x1c71c71c71c71c6 < this_00) {
      this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                 *)0x1c71c71c71c71c7;
    }
    __alloc = (_Tp_alloc_type *)(uVar6 + uVar2);
    if (CARRY8(uVar6,uVar2)) {
      this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                 *)0x1c71c71c71c71c7;
    }
    __result = std::
               _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
               ::_M_allocate(this_00,(size_t)pub);
    puVar3 = (undefined8 *)((long)__result + lVar7);
    puVar3[4] = 0;
    puVar3[5] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[6] = 0;
    puVar3[7] = 0;
    puVar3[8] = 0;
    *puVar3 = puVar3 + 2;
    puVar3[1] = 0;
    *(long *)((long)__result + lVar7 + 0x20) = (long)__result + lVar7 + 0x30;
    pTVar4 = std::
             vector<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ::_S_relocate(__first,pTVar5,__result,__alloc);
    pTVar5 = std::
             vector<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ::_S_relocate(pTVar5,pTVar5,pTVar4 + 1,__alloc);
    lVar7 = (long)(this->vDerive).
                  super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                     *)__first,(pointer)(lVar7 / 0x48),lVar7 % 0x48);
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar5;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    (pTVar5->prv)._M_dataplus._M_p = (pointer)0x0;
    (pTVar5->prv)._M_string_length = 0;
    (pTVar5->prv).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar5->prv).field_2 + 8) = 0;
    (pTVar5->pub).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar5->pub).field_2 + 8) = 0;
    *(undefined8 *)&pTVar5->nChild = 0;
    (pTVar5->pub)._M_dataplus._M_p = (pointer)&(pTVar5->pub).field_2;
    (pTVar5->pub)._M_string_length = 0;
    (pTVar5->prv)._M_dataplus._M_p = (pointer)&(pTVar5->prv).field_2;
    pTVar5 = (this->vDerive).
             super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar5;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pTVar5[-1].pub,pub);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pTVar5[-1].prv,prv);
  pTVar5[-1].nChild = nChild;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
LAB_0025caa4:
  __stack_chk_fail();
}

Assistant:

TestVector& operator()(std::string pub, std::string prv, unsigned int nChild) {
        vDerive.emplace_back();
        TestDerivation &der = vDerive.back();
        der.pub = pub;
        der.prv = prv;
        der.nChild = nChild;
        return *this;
    }